

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNsMapItemPtr_conflict
xmlDOMWrapNsMapAddItem(xmlNsMapPtr *nsmap,int position,xmlNsPtr oldNs,xmlNsPtr newNs,int depth)

{
  xmlNsMapItemPtr pxVar1;
  xmlNsMapPtr pxVar2;
  xmlNsMapItemPtr_conflict pxVar3;
  
  if (position - 1U < 0xfffffffe || nsmap == (xmlNsMapPtr *)0x0) {
LAB_001521bd:
    pxVar3 = (xmlNsMapItemPtr_conflict)0x0;
  }
  else {
    pxVar2 = *nsmap;
    if (pxVar2 == (xmlNsMapPtr)0x0) {
      pxVar2 = (xmlNsMapPtr)(*xmlMalloc)(0x18);
      if (pxVar2 == (xmlNsMapPtr)0x0) goto LAB_001521bd;
      pxVar2->first = (xmlNsMapItemPtr_conflict)0x0;
      pxVar2->last = (xmlNsMapItemPtr_conflict)0x0;
      pxVar2->pool = (xmlNsMapItemPtr_conflict)0x0;
      *nsmap = pxVar2;
    }
    pxVar3 = pxVar2->pool;
    if (pxVar3 == (xmlNsMapItemPtr_conflict)0x0) {
      pxVar3 = (xmlNsMapItemPtr_conflict)(*xmlMalloc)(0x28);
      if (pxVar3 == (xmlNsMapItemPtr_conflict)0x0) goto LAB_001521bd;
    }
    else {
      pxVar2->pool = pxVar3->next;
    }
    pxVar3->oldNs = (xmlNsPtr)0x0;
    pxVar3->newNs = (xmlNsPtr)0x0;
    pxVar3->next = (xmlNsMapItemPtr)0x0;
    pxVar3->prev = (xmlNsMapItemPtr)0x0;
    pxVar3->shadowDepth = 0;
    pxVar3->depth = 0;
    pxVar1 = pxVar2->first;
    if (pxVar1 == (xmlNsMapItemPtr)0x0) {
      pxVar2->first = pxVar3;
      pxVar2 = (xmlNsMapPtr)&pxVar2->last;
    }
    else if (position == -1) {
      pxVar1 = pxVar2->last;
      pxVar2 = (xmlNsMapPtr)&pxVar2->last;
      pxVar3->prev = pxVar1;
      pxVar1->next = pxVar3;
    }
    else {
      pxVar1->prev = pxVar3;
      pxVar3->next = pxVar1;
    }
    pxVar2->first = pxVar3;
    pxVar3->oldNs = oldNs;
    pxVar3->newNs = newNs;
    pxVar3->shadowDepth = -1;
    pxVar3->depth = depth;
  }
  return pxVar3;
}

Assistant:

static xmlNsMapItemPtr
xmlDOMWrapNsMapAddItem(xmlNsMapPtr *nsmap, int position,
		       xmlNsPtr oldNs, xmlNsPtr newNs, int depth)
{
    xmlNsMapItemPtr ret;
    xmlNsMapPtr map;

    if (nsmap == NULL)
	return(NULL);
    if ((position != -1) && (position != 0))
	return(NULL);
    map = *nsmap;

    if (map == NULL) {
	/*
	* Create the ns-map.
	*/
	map = (xmlNsMapPtr) xmlMalloc(sizeof(struct xmlNsMap));
	if (map == NULL)
	    return(NULL);
	memset(map, 0, sizeof(struct xmlNsMap));
	*nsmap = map;
    }

    if (map->pool != NULL) {
	/*
	* Reuse an item from the pool.
	*/
	ret = map->pool;
	map->pool = ret->next;
	memset(ret, 0, sizeof(struct xmlNsMapItem));
    } else {
	/*
	* Create a new item.
	*/
	ret = (xmlNsMapItemPtr) xmlMalloc(sizeof(struct xmlNsMapItem));
	if (ret == NULL)
	    return(NULL);
	memset(ret, 0, sizeof(struct xmlNsMapItem));
    }

    if (map->first == NULL) {
	/*
	* First ever.
	*/
	map->first = ret;
	map->last = ret;
    } else if (position == -1) {
	/*
	* Append.
	*/
	ret->prev = map->last;
	map->last->next = ret;
	map->last = ret;
    } else if (position == 0) {
	/*
	* Set on first position.
	*/
	map->first->prev = ret;
	ret->next = map->first;
	map->first = ret;
    }

    ret->oldNs = oldNs;
    ret->newNs = newNs;
    ret->shadowDepth = -1;
    ret->depth = depth;
    return (ret);
}